

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePiram>>::Read
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePiram>> *this)

{
  void *in_stack_00000010;
  TPZStream *in_stack_00000018;
  TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePiram>_> *in_stack_00000020;
  
  TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePiram>_>::Read
            (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::Read(TPZStream &buf, void *context)
{
    TBASE::Read(buf,context);
    buf.Read( fIntPtIndices);
    int classid;
    buf.Read(&classid);
    if (classid != ClassId()) {
        DebugStop();
    }
}